

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient3d(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int elen;
  int iVar21;
  int iVar22;
  uint uVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined4 uVar49;
  double b;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dStack_1270;
  double dStack_1260;
  double dStack_1250;
  double dStack_1230;
  double dStack_1210;
  double dStack_1200;
  double dStack_11e0;
  double dStack_11d0;
  double dStack_11c0;
  double dStack_11b0;
  double dStack_1158;
  double dStack_1150;
  double dStack_1148;
  double dStack_1140;
  undefined1 auStack_1138 [16];
  undefined1 auStack_1128 [16];
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double dStack_1100;
  double dStack_10f8;
  double dStack_10f0;
  double dStack_10e8;
  double dStack_10e0;
  undefined1 auStack_10d8 [16];
  double dStack_10c8;
  double dStack_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double dStack_10a8;
  double dStack_10a0;
  undefined1 auStack_1098 [16];
  double dStack_1088;
  double dStack_1080;
  undefined1 auStack_1078 [16];
  undefined1 auStack_1068 [16];
  double dStack_1058;
  double dStack_1050;
  undefined1 auStack_1048 [16];
  undefined1 auStack_1038 [16];
  double dStack_1028;
  double dStack_1020;
  double dStack_1018;
  undefined8 uStack_1010;
  undefined1 auStack_1008 [16];
  undefined1 auStack_ff8 [16];
  double dStack_fe8;
  undefined8 uStack_fe0;
  undefined1 auStack_fd8 [16];
  undefined1 auStack_fc8 [16];
  undefined1 auStack_fb8 [16];
  double dStack_fa8;
  undefined8 uStack_fa0;
  undefined1 auStack_f98 [16];
  undefined1 auStack_f88 [16];
  undefined1 auStack_f78 [16];
  double dStack_f68;
  double dStack_f60;
  undefined1 auStack_f58 [16];
  double dStack_f48;
  double dStack_f40;
  undefined1 auStack_f38 [16];
  double dStack_f28;
  double dStack_f20;
  double adStack_f18 [16];
  double adStack_e98 [12];
  double adStack_e38 [8];
  double adStack_df8 [8];
  double adStack_db8 [8];
  double adStack_d78 [8];
  double adStack_d38 [8];
  double adStack_cf8 [8];
  double adStack_cb8 [16];
  double adStack_c38 [192];
  double adStack_638 [193];
  
  dVar34 = splitter;
  auStack_1078._8_8_ = auStack_1078._0_8_;
  auStack_10d8._8_8_ = auStack_10d8._0_8_;
  auStack_1038._8_8_ = auStack_1038._0_8_;
  dVar1 = pd[2];
  dVar55 = *pd;
  dVar37 = pd[1];
  dVar50 = (pb[1] - dVar37) * (*pc - dVar55);
  dVar29 = (*pb - dVar55) * (pc[1] - dVar37);
  dVar36 = (pb[1] - dVar37) * (*pa - dVar55);
  dVar45 = (*pb - dVar55) * (pa[1] - dVar37);
  dVar46 = (pa[1] - dVar37) * (*pc - dVar55);
  dVar55 = (*pa - dVar55) * (pc[1] - dVar37);
  dVar37 = (dVar36 - dVar45) * (pc[2] - dVar1) +
           (dVar29 - dVar50) * (pa[2] - dVar1) + (dVar46 - dVar55) * (pb[2] - dVar1);
  if ((_use_inexact_arith != 0) ||
     ((_use_static_filter != 0 && ((o3dstaticfilter < dVar37 || (dVar37 < -o3dstaticfilter)))))) {
    return dVar37;
  }
  dVar1 = ABS(pc[2] - dVar1) * (ABS(dVar45) + ABS(dVar36)) +
          ABS(pa[2] - dVar1) * (ABS(dVar29) + ABS(dVar50)) +
          ABS(pb[2] - dVar1) * (ABS(dVar55) + ABS(dVar46));
  if (o3derrboundA * dVar1 < dVar37) {
    return dVar37;
  }
  if (o3derrboundA * dVar1 < -dVar37) {
    return dVar37;
  }
  dVar36 = *pa;
  dStack_fa8 = pb[1];
  dVar45 = *pb;
  dStack_1108 = *pc;
  auStack_fb8 = *(undefined1 (*) [16])pd;
  dVar28 = auStack_fb8._0_8_;
  auVar2._8_4_ = SUB84(dStack_1108,0);
  auVar2._0_8_ = dVar45;
  auVar2._12_4_ = (int)((ulong)dStack_1108 >> 0x20);
  auStack_fc8._8_4_ = auStack_fb8._0_4_;
  auStack_fc8._0_8_ = dVar28;
  auStack_fc8._12_4_ = auStack_fb8._4_4_;
  dVar37 = dVar45 - dVar28;
  dStack_1108 = dStack_1108 - dVar28;
  uVar49 = (undefined4)((ulong)dStack_1108 >> 0x20);
  uStack_fa0 = 0;
  dVar28 = dVar36 - dVar28;
  dVar46 = auStack_fb8._8_8_;
  dVar38 = dStack_fa8 - dVar46;
  dVar50 = pc[1];
  dVar29 = pa[1];
  auVar3._8_4_ = SUB84(dVar29,0);
  auVar3._0_8_ = dVar50;
  auVar3._12_4_ = (int)((ulong)dVar29 >> 0x20);
  auStack_fd8._8_4_ = auStack_fb8._8_4_;
  auStack_fd8._0_8_ = dVar46;
  auStack_fd8._12_4_ = auStack_fb8._12_4_;
  dVar35 = dVar50 - dVar46;
  auVar4._8_4_ = SUB84(dVar29 - dVar46,0);
  auVar4._0_8_ = dVar35;
  auVar4._12_4_ = (int)((ulong)(dVar29 - dVar46) >> 0x20);
  dStack_1018 = splitter;
  uStack_1010 = 0;
  auVar5._8_4_ = SUB84(splitter,0);
  auVar5._0_8_ = splitter;
  auVar5._12_4_ = (int)((ulong)splitter >> 0x20);
  dVar40 = dStack_1108 * splitter - (dStack_1108 * splitter - dStack_1108);
  dVar46 = dVar35 * splitter - (dVar35 * splitter - dVar35);
  dVar44 = dVar38 * splitter - (dVar38 * splitter - dVar38);
  dVar39 = dVar37 * splitter - (dVar37 * splitter - dVar37);
  uVar23 = (uint)((ulong)dVar39 >> 0x20);
  dVar29 = dVar37 * dVar35;
  auVar10._8_4_ = SUB84(dStack_1108,0);
  auVar10._0_8_ = dVar37;
  auVar10._12_4_ = uVar49;
  auStack_1008._8_4_ = SUB84(dStack_1108,0);
  auStack_1008._0_8_ = dVar35;
  auStack_1008._12_4_ = uVar49;
  dVar54 = dVar28 * dVar35;
  dVar55 = dVar38 * dStack_1108;
  auVar8._8_4_ = SUB84(dVar39,0);
  auVar8._0_8_ = dVar44;
  auVar8._12_4_ = uVar23;
  auStack_1128._8_4_ = SUB84(dVar46,0);
  auStack_1128._0_8_ = dVar40;
  auStack_1128._12_4_ = (int)((ulong)dVar46 >> 0x20);
  dStack_1118 = dStack_1108 - dVar40;
  dStack_1110 = dVar35 - dVar46;
  dVar53 = dVar38 - dVar44;
  dVar52 = dVar37 - dVar39;
  auVar12._8_4_ = SUB84(dVar52,0);
  auVar12._0_8_ = dVar53;
  auVar12._12_4_ = (int)((ulong)dVar52 >> 0x20);
  dVar33 = dVar53 * dStack_1118 -
           (((dVar55 - dVar40 * dVar44) - dStack_1118 * dVar44) - dVar53 * dVar40);
  dVar51 = dVar52 * dStack_1110 -
           (((dVar29 - dVar39 * dVar46) - dVar52 * dVar46) - dStack_1110 * dVar39);
  dVar47 = dVar51 - dVar33;
  dVar41 = dVar29 + dVar47;
  dVar30 = (dVar29 - (dVar41 - (dVar41 - dVar29))) + (dVar47 - (dVar41 - dVar29));
  auVar13._8_4_ = SUB84(dVar55,0);
  auVar13._0_8_ = dVar54;
  auVar13._12_4_ = (int)((ulong)dVar55 >> 0x20);
  dVar31 = dVar30 - dVar55;
  dVar29 = pa[2];
  dVar46 = pb[2];
  dVar30 = (dVar30 - (dVar31 + (dVar30 - dVar31))) + ((dVar30 - dVar31) - dVar55);
  dStack_fe8 = pd[2];
  dVar55 = pc[2];
  auStack_f38._8_4_ = SUB84(dVar30,0);
  auStack_f38._0_8_ = (dVar51 - (dVar47 + (dVar51 - dVar47))) + ((dVar51 - dVar47) - dVar33);
  auStack_f38._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dStack_f20 = dVar41 + dVar31;
  dStack_f28 = (dVar41 - (dStack_f20 - (dStack_f20 - dVar41))) + (dVar31 - (dStack_f20 - dVar41));
  dVar31 = dVar55 - dStack_fe8;
  uStack_fe0 = 0;
  auStack_ff8._8_4_ = SUB84(dStack_fe8,0);
  auStack_ff8._0_8_ = dStack_fe8;
  auStack_ff8._12_4_ = (int)((ulong)dStack_fe8 >> 0x20);
  dVar41 = dVar29 - dStack_fe8;
  b = dVar46 - dStack_fe8;
  dVar40 = -dVar40;
  auVar6._8_4_ = SUB84(dVar39,0);
  auVar6._0_8_ = dVar40;
  auVar6._12_4_ = uVar23 ^ 0x80000000;
  dVar51 = -dStack_1118;
  dStack_1100 = dStack_1108;
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_f38,dVar41,adStack_d78);
  dStack_1260 = auVar4._8_8_;
  dStack_1088 = dStack_1260;
  dStack_1080 = dStack_1260;
  dVar33 = dStack_1108 * dStack_1260;
  dStack_1270 = auVar5._8_8_;
  dVar42 = dVar34 * dStack_1260 - (dVar34 * dStack_1260 - dStack_1260);
  dVar47 = dStack_1270 * dVar28 - (dStack_1270 * dVar28 - dVar28);
  dVar39 = dStack_1260 - dVar42;
  dVar30 = dVar28 - dVar47;
  dVar47 = -dVar47;
  auStack_1138._8_8_ = -dVar30;
  auStack_1138._0_8_ = -dVar30;
  auStack_f98._8_4_ = SUB84(dVar30,0);
  auStack_f98._0_8_ = dVar39;
  auStack_f98._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dVar43 = dStack_1118 * dVar39 - (dVar39 * dVar40 + dVar42 * dVar51 + dVar33 + dVar42 * dVar40);
  dVar48 = dStack_1110 * dVar30 -
           (dVar47 * dStack_1110 +
           -dVar30 * (double)auStack_1128._8_8_ + dVar54 + dVar47 * (double)auStack_1128._8_8_);
  dVar51 = dVar43 - dVar48;
  dVar32 = dVar33 + dVar51;
  dVar34 = (dVar33 - (dVar32 - (dVar32 - dVar33))) + (dVar51 - (dVar32 - dVar33));
  dVar40 = dVar34 - dVar54;
  dVar34 = (dVar34 - ((dVar34 - dVar40) + dVar40)) + ((dVar34 - dVar40) - dVar54);
  auStack_f58._8_4_ = SUB84(dVar34,0);
  auStack_f58._0_8_ = (dVar43 - (dVar51 + (dVar43 - dVar51))) + ((dVar43 - dVar51) - dVar48);
  auStack_f58._12_4_ = (int)((ulong)dVar34 >> 0x20);
  dStack_f40 = dVar32 + dVar40;
  dStack_f48 = (dVar32 - (dStack_f40 - (dStack_f40 - dVar32))) + (dVar40 - (dStack_f40 - dVar32));
  auStack_f88._8_4_ = SUB84(dVar39,0);
  auStack_f88._0_8_ = dVar30;
  auStack_f88._12_4_ = (int)((ulong)dVar39 >> 0x20);
  auStack_1098._8_4_ = SUB84(b,0);
  auStack_1098._0_8_ = b;
  auStack_1098._12_4_ = (int)((ulong)b >> 0x20);
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_f58,b,adStack_cf8);
  dVar40 = dVar38 * dVar28;
  dVar39 = dStack_1260 * dVar37;
  dStack_1230 = auVar6._8_8_;
  dStack_1200 = auVar12._8_8_;
  dVar30 = (double)auStack_f88._0_8_ * dVar53 -
           (dVar53 * dVar47 + (double)auStack_1138._0_8_ * dVar44 + dVar47 * dVar44 + dVar40);
  dVar47 = (double)auStack_f88._8_8_ * dStack_1200 -
           ((double)auStack_f98._0_8_ * dStack_1230 +
           -dVar52 * dVar42 + dStack_1230 * dVar42 + dVar39);
  dVar51 = dVar30 - dVar47;
  dVar34 = dVar40 + dVar51;
  dVar40 = (dVar40 - (dVar34 - (dVar34 - dVar40))) + (dVar51 - (dVar34 - dVar40));
  dVar33 = dVar40 - dVar39;
  dVar40 = (dVar40 - ((dVar40 - dVar33) + dVar33)) + ((dVar40 - dVar33) - dVar39);
  auStack_f78._8_4_ = SUB84(dVar40,0);
  auStack_f78._0_8_ = (dVar30 - (dVar51 + (dVar30 - dVar51))) + ((dVar30 - dVar51) - dVar47);
  auStack_f78._12_4_ = (int)((ulong)dVar40 >> 0x20);
  dStack_f60 = dVar34 + dVar33;
  dStack_f68 = (dVar34 - (dStack_f60 - (dStack_f60 - dVar34))) + (dVar33 - (dStack_f60 - dVar34));
  pdVar24 = adStack_d38;
  iVar20 = scale_expansion_zeroelim(4,(double *)auStack_f78,dVar31,pdVar24);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,adStack_d78,iVar19,adStack_cf8,adStack_cb8);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,adStack_cb8,iVar20,pdVar24,adStack_c38);
  uVar49 = SUB84(pdVar24,0);
  dVar34 = estimate(iVar18,adStack_c38);
  if (o3derrboundB * dVar1 <= dVar34) {
    return dVar34;
  }
  if (o3derrboundB * dVar1 <= -dVar34) {
    return dVar34;
  }
  dVar40 = (dVar36 - (dVar28 + (dVar36 - dVar28))) + ((dVar36 - dVar28) - (double)auStack_fb8._0_8_)
  ;
  dStack_1210 = auVar2._8_8_;
  dStack_11e0 = auVar10._8_8_;
  dStack_1250 = auVar3._8_8_;
  dVar33 = (dVar45 - (dVar37 + (dVar45 - dVar37))) + ((dVar45 - dVar37) - (double)auStack_fc8._0_8_)
  ;
  dVar51 = (dStack_1210 - (dStack_11e0 + (dStack_1210 - dStack_11e0))) +
           ((dStack_1210 - dStack_11e0) - (double)auStack_fc8._8_8_);
  dVar36 = (dVar50 - (dVar35 + (dVar50 - dVar35))) + ((dVar50 - dVar35) - (double)auStack_fd8._0_8_)
  ;
  dVar45 = (dStack_1250 - (dStack_1260 + (dStack_1250 - dStack_1260))) +
           ((dStack_1250 - dStack_1260) - (double)auStack_fd8._8_8_);
  dVar50 = (dVar29 - (dVar41 + (dVar29 - dVar41))) + ((dVar29 - dVar41) - (double)auStack_ff8._0_8_)
  ;
  dVar29 = (dVar46 - (b + (dVar46 - b))) + ((dVar46 - b) - (double)auStack_ff8._8_8_);
  dVar46 = (dVar55 - (dVar31 + (dVar55 - dVar31))) + ((dVar55 - dVar31) - dStack_fe8);
  dVar55 = (dStack_fa8 - (dVar38 + (dStack_fa8 - dVar38))) +
           ((dStack_fa8 - dVar38) - (double)auStack_fb8._8_8_);
  auVar7._8_8_ = -(ulong)(dVar55 == 0.0);
  auVar7._0_8_ = -(ulong)(dVar46 == 0.0);
  uVar23 = movmskpd(uVar49,auVar7);
  bVar17 = (byte)uVar23;
  if (((((dVar40 == 0.0) && (!NAN(dVar40))) && (dVar33 == 0.0)) &&
      ((!NAN(dVar33) && (dVar51 == 0.0)))) &&
     ((((!NAN(dVar51) && ((dVar45 == 0.0 && (!NAN(dVar45))))) && (bVar17 >> 1 != 0)) &&
      ((((dVar36 == 0.0 && (!NAN(dVar36))) && (dVar50 == 0.0)) &&
       (((!NAN(dVar50) && (dVar29 == 0.0)) && ((!NAN(dVar29) && ((uVar23 & 1) != 0)))))))))) {
    return dVar34;
  }
  dVar43 = dVar1 * o3derrboundC + ABS(dVar34) * resulterrbound;
  dVar47 = dVar33 * dVar35;
  dVar32 = dVar51 * dStack_1260;
  dVar1 = dVar55 * dStack_11e0;
  dVar30 = dVar36 * dVar28;
  auVar9._8_4_ = SUB84(dVar45,0);
  auVar9._0_8_ = dVar36;
  auVar9._12_4_ = (int)((ulong)dVar45 >> 0x20);
  auVar11._8_4_ = SUB84(dVar32,0);
  auVar11._0_8_ = dVar47;
  auVar11._12_4_ = (int)((ulong)dVar32 >> 0x20);
  auStack_1138._8_4_ = SUB84(dVar30,0);
  auStack_1138._0_8_ = dVar1;
  auStack_1138._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dStack_11b0 = auVar13._8_8_;
  dVar52 = dVar40 * dVar38;
  dVar42 = dVar37 * dVar45;
  dVar34 = ((dVar28 * dVar55 + dVar52) - (dStack_1088 * dVar33 + dVar42)) * dVar31 +
           (dVar28 * dVar38 - dVar39) * dVar46 +
           ((dStack_11e0 * dVar45 + dVar32) - (dVar40 * dVar35 + dVar30)) * b +
           (dStack_1260 * (double)auStack_1008._8_8_ - dVar54) * dVar29 +
           ((dVar37 * dVar36 + dVar47) - (dVar51 * dVar38 + dVar1)) * dVar41 +
           (dVar37 * (double)auStack_1008._0_8_ - dStack_11b0) * dVar50 + dVar34;
  if (dVar43 <= dVar34) {
    return dVar34;
  }
  if (dVar43 <= -dVar34) {
    return dVar34;
  }
  iVar19 = 2;
  dStack_11c0 = auVar8._8_8_;
  if ((dVar40 != 0.0) || (NAN(dVar40))) {
    dVar34 = dVar40 * dStack_1018 - (dVar40 * dStack_1018 - dVar40);
    dVar39 = dVar40 - dVar34;
    dStack_10b8 = dVar53 * dVar39 -
                  (((dVar52 - dVar34 * dVar44) - dVar44 * dVar39) - dVar34 * dVar53);
    if ((dVar45 != 0.0) || (NAN(dVar45))) {
      dVar43 = dStack_1018 * dVar45 - (dStack_1018 * dVar45 - dVar45);
      dVar44 = dVar45 - dVar43;
      dVar54 = dStack_1200 * dVar44 -
               (((dVar42 - dVar43 * dStack_11c0) - dStack_11c0 * dVar44) - dVar43 * dStack_1200);
      dVar48 = dStack_10b8 - dVar54;
      dVar32 = dVar52 + dVar48;
      dVar30 = (dVar52 - (dVar32 - (dVar32 - dVar52))) + (dVar48 - (dVar32 - dVar52));
      dVar53 = dVar30 - dVar42;
      dStack_10b8 = (dStack_10b8 - (dVar48 + (dStack_10b8 - dVar48))) +
                    ((dStack_10b8 - dVar48) - dVar54);
      dStack_10b0 = (dVar30 - ((dVar30 - dVar53) + dVar53)) + ((dVar30 - dVar53) - dVar42);
      dStack_10a0 = dVar32 + dVar53;
      dStack_10a8 = (dVar32 - (dStack_10a0 - (dStack_10a0 - dVar32))) +
                    (dVar53 - (dStack_10a0 - dVar32));
      dStack_1250 = auVar9._8_8_;
      dStack_1250 = dStack_1250 * dStack_11e0;
      dVar30 = dVar35 * dVar40;
      dVar44 = dVar44 * dStack_1118 -
               (-dVar43 * dStack_1118 +
               -dVar44 * (double)auStack_1128._0_8_ +
               -dVar43 * (double)auStack_1128._0_8_ + dStack_1250);
      dVar34 = dVar39 * dStack_1110 -
               (-dVar34 * dStack_1110 +
               -dVar39 * (double)auStack_1128._8_8_ + -dVar34 * (double)auStack_1128._8_8_ + dVar30)
      ;
      dVar54 = dVar44 - dVar34;
      dVar52 = dStack_1250 + dVar54;
      dVar39 = (dStack_1250 - (dVar52 - (dVar52 - dStack_1250))) + (dVar54 - (dVar52 - dStack_1250))
      ;
      dVar53 = dVar39 - dVar30;
      dVar39 = (dVar39 - (dVar53 + (dVar39 - dVar53))) + ((dVar39 - dVar53) - dVar30);
      auStack_1038._8_4_ = SUB84(dVar39,0);
      auStack_1038._0_8_ = (dVar44 - (dVar54 + (dVar44 - dVar54))) + ((dVar44 - dVar54) - dVar34);
      auStack_1038._12_4_ = (int)((ulong)dVar39 >> 0x20);
      dStack_1020 = dVar52 + dVar53;
      dStack_1028 = (dVar52 - (dStack_1020 - (dStack_1020 - dVar52))) +
                    (dVar53 - (dStack_1020 - dVar52));
      iVar19 = 4;
    }
    else {
      dVar34 = -dVar40;
      dVar44 = dStack_1018 * dVar34 - (dVar40 + dStack_1018 * dVar34);
      auStack_1038._8_8_ = dVar35 * dVar34;
      auStack_1038._0_8_ =
           dStack_1110 * (dVar34 - dVar44) -
           (((dVar35 * dVar34 - dVar44 * (double)auStack_1128._8_8_) -
            (double)auStack_1128._8_8_ * (dVar34 - dVar44)) - dVar44 * dStack_1110);
      dStack_10b0 = dVar52;
    }
  }
  else if ((dVar45 != 0.0) || (NAN(dVar45))) {
    dVar34 = -dVar45;
    dVar44 = dStack_1018 * dVar34 - (dVar45 + dStack_1018 * dVar34);
    dStack_10b8 = (dVar34 - dVar44) * dStack_1200 -
                  (((dVar37 * dVar34 - dVar44 * dStack_11c0) - dStack_11c0 * (dVar34 - dVar44)) -
                  dVar44 * dStack_1200);
    dVar44 = dStack_1018 * dVar45 - (dStack_1018 * dVar45 - dVar45);
    auStack_1038._8_8_ = dStack_1108 * dVar45;
    auStack_1038._0_8_ =
         (dVar45 - dVar44) * dStack_1118 -
         (((dStack_1108 * dVar45 - dVar44 * (double)auStack_1128._0_8_) -
          (double)auStack_1128._0_8_ * (dVar45 - dVar44)) - dVar44 * dStack_1118);
    dStack_10b0 = dVar37 * dVar34;
  }
  else {
    dStack_10b8 = 0.0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auStack_1038._8_8_;
    auStack_1038 = auVar14 << 0x40;
    iVar19 = 1;
  }
  dStack_11d0 = auVar11._8_8_;
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    dVar44 = dVar33 * splitter - (dVar33 * splitter - dVar33);
    dVar39 = dVar33 - dVar44;
    dVar34 = dVar35 * splitter - (dVar35 * splitter - dVar35);
    auStack_10d8._0_8_ =
         (dVar35 - dVar34) * dVar39 -
         (((dVar47 - dVar44 * dVar34) - dVar34 * dVar39) - dVar44 * (dVar35 - dVar34));
    if (bVar17 >> 1 != 0) {
      auStack_10d8._8_8_ = dVar47;
      dVar34 = -dVar33;
      dStack_1050 = dStack_1088 * dVar34;
      dVar1 = splitter * dVar34 - (dVar33 + splitter * dVar34);
      dVar35 = dStack_1088 * splitter - (dStack_1088 * splitter - dStack_1088);
      dVar44 = ((dStack_1050 - dVar1 * dVar35) - dVar35 * (dVar34 - dVar1)) -
               dVar1 * (dStack_1088 - dVar35);
      dStack_1058 = (dStack_1088 - dVar35) * (dVar34 - dVar1);
      goto LAB_0014fb4b;
    }
    dVar53 = dVar55 * splitter - (dVar55 * splitter - dVar55);
    dVar35 = dVar55 - dVar53;
    dVar34 = dStack_1108 * splitter - (dStack_1108 * splitter - dStack_1108);
    dVar54 = (dStack_1108 - dVar34) * dVar35 -
             (((dVar1 - dVar53 * dVar34) - dVar34 * dVar35) - dVar53 * (dStack_1108 - dVar34));
    dVar52 = (double)auStack_10d8._0_8_ - dVar54;
    dVar34 = dVar47 + dVar52;
    dVar30 = (dVar47 - (dVar34 - (dVar34 - dVar47))) + (dVar52 - (dVar34 - dVar47));
    dVar47 = dVar30 - dVar1;
    dVar1 = (dVar30 - ((dVar30 - dVar47) + dVar47)) + ((dVar30 - dVar47) - dVar1);
    auStack_10d8._8_4_ = SUB84(dVar1,0);
    auStack_10d8._0_8_ =
         ((double)auStack_10d8._0_8_ - (dVar52 + ((double)auStack_10d8._0_8_ - dVar52))) +
         (((double)auStack_10d8._0_8_ - dVar52) - dVar54);
    auStack_10d8._12_4_ = (int)((ulong)dVar1 >> 0x20);
    dStack_10c0 = dVar34 + dVar47;
    dStack_10c8 = (dVar34 - (dStack_10c0 - (dStack_10c0 - dVar34))) +
                  (dVar47 - (dStack_10c0 - dVar34));
    dVar1 = splitter * dVar28 - (splitter * dVar28 - dVar28);
    dVar34 = splitter * dStack_1260 - (splitter * dStack_1260 - dStack_1260);
    dVar30 = dVar55 * dVar28;
    dVar47 = dVar33 * dStack_1260;
    dVar35 = dVar35 * (dVar28 - dVar1) -
             (-dVar53 * (dVar28 - dVar1) + -dVar35 * dVar1 + -dVar53 * dVar1 + dVar30);
    dVar34 = dVar39 * (dStack_1260 - dVar34) -
             (-dVar44 * (dStack_1260 - dVar34) + -dVar39 * dVar34 + -dVar44 * dVar34 + dVar47);
    dVar44 = dVar35 - dVar34;
    dVar1 = dVar30 + dVar44;
    dVar39 = (dVar30 - (dVar1 - (dVar1 - dVar30))) + (dVar44 - (dVar1 - dVar30));
    dVar30 = dVar39 - dVar47;
    dStack_1058 = (dVar35 - (dVar44 + (dVar35 - dVar44))) + ((dVar35 - dVar44) - dVar34);
    dStack_1050 = (dVar39 - (dVar30 + (dVar39 - dVar30))) + ((dVar39 - dVar30) - dVar47);
    dVar34 = dVar1 + dVar30;
    auStack_1048._8_4_ = SUB84(dVar34,0);
    auStack_1048._0_8_ = (dVar1 - (dVar34 - (dVar34 - dVar1))) + (dVar30 - (dVar34 - dVar1));
    auStack_1048._12_4_ = (int)((ulong)dVar34 >> 0x20);
    iVar20 = 4;
  }
  else if (bVar17 >> 1 == 0) {
    dVar1 = -dVar55;
    dVar34 = splitter * dVar1 - (dVar55 + splitter * dVar1);
    dVar35 = dStack_1108 * splitter - (dStack_1108 * splitter - dStack_1108);
    auStack_10d8._8_8_ = dStack_1108 * dVar1;
    auStack_10d8._0_8_ =
         (dStack_1108 - dVar35) * (dVar1 - dVar34) -
         (((dStack_1108 * dVar1 - dVar34 * dVar35) - dVar35 * (dVar1 - dVar34)) -
         dVar34 * (dStack_1108 - dVar35));
    dStack_1050 = dVar28 * dVar55;
    dVar34 = dVar55 * splitter - (dVar55 * splitter - dVar55);
    dVar1 = splitter * dVar28 - (splitter * dVar28 - dVar28);
    dVar44 = ((dStack_1050 - dVar34 * dVar1) - dVar1 * (dVar55 - dVar34)) -
             dVar34 * (dVar28 - dVar1);
    dStack_1058 = (dVar28 - dVar1) * (dVar55 - dVar34);
LAB_0014fb4b:
    dStack_1058 = dStack_1058 - dVar44;
    iVar20 = 2;
  }
  else {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auStack_10d8._8_8_;
    auStack_10d8 = auVar15 << 0x40;
    dStack_1058 = 0.0;
    iVar20 = 1;
  }
  if ((dVar51 != 0.0) || (NAN(dVar51))) {
    dVar1 = dVar51 * splitter - (dVar51 * splitter - dVar51);
    dVar35 = dVar51 - dVar1;
    dVar34 = dStack_1088 * splitter - (dStack_1088 * splitter - dStack_1088);
    dStack_10f8 = (dStack_1088 - dVar34) * dVar35 -
                  (((dStack_11d0 - dVar1 * dVar34) - dVar34 * dVar35) -
                  dVar1 * (dStack_1088 - dVar34));
    if ((dVar36 == 0.0) && (!NAN(dVar36))) {
      dStack_10f0 = dStack_11d0;
      dVar34 = -dVar51;
      auStack_1078._8_8_ = dVar38 * dVar34;
      dVar1 = splitter * dVar34 - (dVar51 + splitter * dVar34);
      dVar37 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      auStack_1078._0_8_ =
           (dVar38 - dVar37) * (dVar34 - dVar1) -
           ((((double)auStack_1078._8_8_ - dVar1 * dVar37) - dVar37 * (dVar34 - dVar1)) -
           dVar1 * (dVar38 - dVar37));
      goto LAB_0015008a;
    }
    dVar30 = dVar36 * splitter - (dVar36 * splitter - dVar36);
    dVar39 = dVar36 - dVar30;
    dVar34 = dVar28 * splitter - (dVar28 * splitter - dVar28);
    dVar44 = (dVar28 - dVar34) * dVar39 -
             ((((double)auStack_1138._8_8_ - dVar30 * dVar34) - dVar34 * dVar39) -
             dVar30 * (dVar28 - dVar34));
    dVar28 = dStack_10f8 - dVar44;
    dVar34 = dStack_11d0 + dVar28;
    dVar47 = (dStack_11d0 - (dVar34 - (dVar34 - dStack_11d0))) + (dVar28 - (dVar34 - dStack_11d0));
    dVar53 = dVar47 - (double)auStack_1138._8_8_;
    dStack_10f8 = (dStack_10f8 - (dVar28 + (dStack_10f8 - dVar28))) +
                  ((dStack_10f8 - dVar28) - dVar44);
    dStack_10f0 = (dVar47 - ((dVar47 - dVar53) + dVar53)) +
                  ((dVar47 - dVar53) - (double)auStack_1138._8_8_);
    dStack_10e0 = dVar34 + dVar53;
    dStack_10e8 = (dVar34 - (dStack_10e0 - (dStack_10e0 - dVar34))) +
                  (dVar53 - (dStack_10e0 - dVar34));
    dVar34 = splitter * dVar37 - (splitter * dVar37 - dVar37);
    dVar44 = splitter * dVar38 - (splitter * dVar38 - dVar38);
    dVar28 = dVar36 * dVar37;
    dVar47 = dVar51 * dVar38;
    dVar34 = dVar39 * (dVar37 - dVar34) -
             (-dVar30 * (dVar37 - dVar34) + -dVar39 * dVar34 + -dVar30 * dVar34 + dVar28);
    dVar35 = dVar35 * (dVar38 - dVar44) -
             (-dVar1 * (dVar38 - dVar44) + -dVar35 * dVar44 + -dVar1 * dVar44 + dVar47);
    dVar37 = dVar34 - dVar35;
    dVar1 = dVar28 + dVar37;
    dVar44 = (dVar28 - (dVar1 - (dVar1 - dVar28))) + (dVar37 - (dVar1 - dVar28));
    dVar39 = dVar44 - dVar47;
    dVar44 = (dVar44 - (dVar39 + (dVar44 - dVar39))) + ((dVar44 - dVar39) - dVar47);
    auStack_1078._8_4_ = SUB84(dVar44,0);
    auStack_1078._0_8_ = (dVar34 - (dVar37 + (dVar34 - dVar37))) + ((dVar34 - dVar37) - dVar35);
    auStack_1078._12_4_ = (int)((ulong)dVar44 >> 0x20);
    dVar37 = dVar1 + dVar39;
    auStack_1068._8_4_ = SUB84(dVar37,0);
    auStack_1068._0_8_ = (dVar1 - (dVar37 - (dVar37 - dVar1))) + (dVar39 - (dVar37 - dVar1));
    auStack_1068._12_4_ = (int)((ulong)dVar37 >> 0x20);
    iVar22 = 4;
  }
  else if ((dVar36 != 0.0) || (NAN(dVar36))) {
    dVar35 = -dVar36;
    dStack_10f0 = dVar28 * dVar35;
    dVar1 = splitter * dVar35 - (dVar36 + splitter * dVar35);
    dVar34 = dVar28 * splitter - (dVar28 * splitter - dVar28);
    dStack_10f8 = (dVar28 - dVar34) * (dVar35 - dVar1) -
                  (((dStack_10f0 - dVar1 * dVar34) - dVar34 * (dVar35 - dVar1)) -
                  dVar1 * (dVar28 - dVar34));
    auStack_1078._8_8_ = dVar37 * dVar36;
    dVar34 = dVar36 * splitter - (dVar36 * splitter - dVar36);
    dVar1 = splitter * dVar37 - (splitter * dVar37 - dVar37);
    auStack_1078._0_8_ =
         (dVar37 - dVar1) * (dVar36 - dVar34) -
         ((((double)auStack_1078._8_8_ - dVar34 * dVar1) - dVar1 * (dVar36 - dVar34)) -
         dVar34 * (dVar37 - dVar1));
LAB_0015008a:
    iVar22 = 2;
  }
  else {
    dStack_10f8 = 0.0;
    iVar22 = 1;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auStack_1078._8_8_;
    auStack_1078 = auVar16 << 0x40;
  }
  elen = fast_expansion_sum_zeroelim
                   (iVar20,(double *)auStack_10d8,iVar22,(double *)auStack_1078,adStack_db8);
  iVar21 = scale_expansion_zeroelim(elen,adStack_db8,dVar41,adStack_f18);
  pdVar24 = adStack_638;
  iVar18 = fast_expansion_sum_zeroelim(iVar18,adStack_c38,iVar21,adStack_f18,pdVar24);
  iVar22 = fast_expansion_sum_zeroelim
                     (iVar22,&dStack_10f8,iVar19,(double *)auStack_1038,adStack_df8);
  iVar21 = scale_expansion_zeroelim(iVar22,adStack_df8,(double)auStack_1098._0_8_,adStack_f18);
  pdVar25 = adStack_c38;
  iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar21,adStack_f18,pdVar25);
  iVar19 = fast_expansion_sum_zeroelim(iVar19,&dStack_10b8,iVar20,&dStack_1058,adStack_e38);
  iVar20 = scale_expansion_zeroelim(iVar19,adStack_e38,dVar31,adStack_f18);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar20,adStack_f18,pdVar24);
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    iVar20 = scale_expansion_zeroelim(4,(double *)auStack_f38,dVar50,adStack_e98);
    pdVar25 = adStack_638;
    pdVar24 = adStack_c38;
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar20,adStack_e98,pdVar24);
  }
  if ((dVar29 != 0.0) || (pdVar26 = pdVar25, NAN(dVar29))) {
    iVar20 = scale_expansion_zeroelim(4,(double *)auStack_f58,dVar29,adStack_e98);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar20,adStack_e98,pdVar25);
    pdVar26 = pdVar24;
    pdVar24 = pdVar25;
  }
  if ((dVar46 != 0.0) || (pdVar25 = pdVar24, NAN(dVar46))) {
    iVar20 = scale_expansion_zeroelim(4,(double *)auStack_f78,dVar46,adStack_e98);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar20,adStack_e98,pdVar26);
    pdVar25 = pdVar26;
    pdVar26 = pdVar24;
  }
  if ((dVar40 != 0.0) || (NAN(dVar40))) {
    if ((dVar55 != 0.0) || (pdVar24 = pdVar25, pdVar27 = pdVar26, NAN(dVar55))) {
      dVar30 = dVar40 * dVar55;
      dVar37 = dVar40 * splitter - (dVar40 * splitter - dVar40);
      dVar1 = dVar55 * splitter - (dVar55 * splitter - dVar55);
      dVar39 = (dVar55 - dVar1) * (dVar40 - dVar37) -
               (((dVar30 - dVar37 * dVar1) - dVar1 * (dVar40 - dVar37)) - dVar37 * (dVar55 - dVar1))
      ;
      dVar44 = dVar31 * splitter - (dVar31 * splitter - dVar31);
      dVar37 = dVar31 - dVar44;
      dVar35 = dVar31 * dVar39;
      dVar1 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      dStack_1158 = (dVar39 - dVar1) * dVar37 -
                    (((dVar35 - dVar1 * dVar44) - (dVar39 - dVar1) * dVar44) - dVar1 * dVar37);
      dVar34 = dVar30 * dVar31;
      dVar1 = splitter * dVar30 - (splitter * dVar30 - dVar30);
      dVar1 = (dVar30 - dVar1) * dVar37 -
              (((dVar34 - dVar1 * dVar44) - dVar44 * (dVar30 - dVar1)) - dVar1 * dVar37);
      dStack_1148 = dVar1 + dVar35;
      dStack_1150 = (dVar35 - (dStack_1148 - (dStack_1148 - dVar35))) +
                    (dVar1 - (dStack_1148 - dVar35));
      dStack_1140 = dVar34 + dStack_1148;
      dStack_1148 = dStack_1148 - (dStack_1140 - dVar34);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1158,pdVar26);
      if ((dVar46 != 0.0) || (pdVar24 = pdVar26, pdVar27 = pdVar25, NAN(dVar46))) {
        dVar44 = dVar46 * splitter - (dVar46 * splitter - dVar46);
        dVar37 = dVar46 - dVar44;
        dVar1 = dVar46 * dVar39;
        dVar34 = dVar39 * splitter - (dVar39 * splitter - dVar39);
        dStack_1158 = (dVar39 - dVar34) * dVar37 -
                      (((dVar1 - dVar34 * dVar44) - (dVar39 - dVar34) * dVar44) - dVar34 * dVar37);
        dVar34 = dVar30 * dVar46;
        dVar35 = splitter * dVar30 - (splitter * dVar30 - dVar30);
        dVar37 = (dVar30 - dVar35) * dVar37 -
                 (((dVar34 - dVar35 * dVar44) - dVar44 * (dVar30 - dVar35)) - dVar35 * dVar37);
        dStack_1148 = dVar1 + dVar37;
        dStack_1150 = (dVar1 - (dStack_1148 - (dStack_1148 - dVar1))) +
                      (dVar37 - (dStack_1148 - dVar1));
        dStack_1140 = dVar34 + dStack_1148;
        dStack_1148 = dStack_1148 - (dStack_1140 - dVar34);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1158,pdVar25);
        pdVar24 = pdVar25;
        pdVar27 = pdVar26;
      }
    }
    if ((dVar36 != 0.0) || (pdVar25 = pdVar24, pdVar26 = pdVar27, NAN(dVar36))) {
      dVar37 = -dVar40;
      dVar44 = dVar36 * dVar37;
      dVar34 = splitter * dVar37 - (dVar40 + splitter * dVar37);
      dVar1 = dVar36 * splitter - (dVar36 * splitter - dVar36);
      dVar39 = (dVar36 - dVar1) * (dVar37 - dVar34) -
               (((dVar44 - dVar34 * dVar1) - dVar1 * (dVar37 - dVar34)) - dVar34 * (dVar36 - dVar1))
      ;
      dVar40 = (double)auStack_1098._0_8_ * splitter -
               ((double)auStack_1098._0_8_ * splitter - (double)auStack_1098._0_8_);
      dVar37 = (double)auStack_1098._0_8_ - dVar40;
      dVar35 = (double)auStack_1098._0_8_ * dVar39;
      dVar1 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      dStack_1158 = (dVar39 - dVar1) * dVar37 -
                    (((dVar35 - dVar1 * dVar40) - (dVar39 - dVar1) * dVar40) - dVar1 * dVar37);
      dVar34 = (double)auStack_1098._0_8_ * dVar44;
      dVar1 = splitter * dVar44 - (splitter * dVar44 - dVar44);
      dVar1 = (dVar44 - dVar1) * dVar37 -
              (((dVar34 - dVar1 * dVar40) - dVar40 * (dVar44 - dVar1)) - dVar1 * dVar37);
      dStack_1148 = dVar1 + dVar35;
      dStack_1150 = (dVar35 - (dStack_1148 - (dStack_1148 - dVar35))) +
                    (dVar1 - (dStack_1148 - dVar35));
      dStack_1140 = dVar34 + dStack_1148;
      dStack_1148 = dStack_1148 - (dStack_1140 - dVar34);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1158,pdVar27);
      if ((dVar29 != 0.0) || (pdVar25 = pdVar27, pdVar26 = pdVar24, NAN(dVar29))) {
        dVar40 = dVar29 * splitter - (dVar29 * splitter - dVar29);
        dVar37 = dVar29 - dVar40;
        dVar1 = dVar29 * dVar39;
        dVar34 = dVar39 * splitter - (dVar39 * splitter - dVar39);
        dStack_1158 = (dVar39 - dVar34) * dVar37 -
                      (((dVar1 - dVar34 * dVar40) - (dVar39 - dVar34) * dVar40) - dVar34 * dVar37);
        dVar34 = dVar44 * dVar29;
        dVar35 = splitter * dVar44 - (splitter * dVar44 - dVar44);
        dVar37 = (dVar44 - dVar35) * dVar37 -
                 (((dVar34 - dVar35 * dVar40) - dVar40 * (dVar44 - dVar35)) - dVar35 * dVar37);
        dStack_1148 = dVar1 + dVar37;
        dStack_1150 = (dVar1 - (dStack_1148 - (dStack_1148 - dVar1))) +
                      (dVar37 - (dStack_1148 - dVar1));
        dStack_1140 = dVar34 + dStack_1148;
        dStack_1148 = dStack_1148 - (dStack_1140 - dVar34);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1158,pdVar24);
        pdVar25 = pdVar24;
        pdVar26 = pdVar27;
      }
    }
  }
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    if ((dVar36 != 0.0) || (pdVar24 = pdVar25, pdVar27 = pdVar26, NAN(dVar36))) {
      dVar44 = dVar33 * dVar36;
      dVar37 = dVar33 * splitter - (dVar33 * splitter - dVar33);
      dVar1 = dVar36 * splitter - (dVar36 * splitter - dVar36);
      dVar34 = (dVar36 - dVar1) * (dVar33 - dVar37) -
               (((dVar44 - dVar37 * dVar1) - dVar1 * (dVar33 - dVar37)) - dVar37 * (dVar36 - dVar1))
      ;
      dVar40 = dVar41 * splitter - (dVar41 * splitter - dVar41);
      dVar36 = dVar41 - dVar40;
      dVar35 = dVar41 * dVar34;
      dVar1 = splitter * dVar34 - (splitter * dVar34 - dVar34);
      dStack_1158 = (dVar34 - dVar1) * dVar36 -
                    (((dVar35 - dVar1 * dVar40) - (dVar34 - dVar1) * dVar40) - dVar1 * dVar36);
      dVar37 = dVar41 * dVar44;
      dVar1 = splitter * dVar44 - (splitter * dVar44 - dVar44);
      dVar1 = (dVar44 - dVar1) * dVar36 -
              (((dVar37 - dVar1 * dVar40) - dVar40 * (dVar44 - dVar1)) - dVar1 * dVar36);
      dStack_1148 = dVar1 + dVar35;
      dStack_1150 = (dVar35 - (dStack_1148 - (dStack_1148 - dVar35))) +
                    (dVar1 - (dStack_1148 - dVar35));
      dStack_1140 = dVar37 + dStack_1148;
      dStack_1148 = dStack_1148 - (dStack_1140 - dVar37);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1158,pdVar26);
      if ((dVar50 != 0.0) || (pdVar24 = pdVar26, pdVar27 = pdVar25, NAN(dVar50))) {
        dVar35 = dVar50 * splitter - (dVar50 * splitter - dVar50);
        dVar1 = dVar50 - dVar35;
        dVar40 = dVar50 * dVar34;
        dVar36 = dVar34 * splitter - (dVar34 * splitter - dVar34);
        dStack_1158 = (dVar34 - dVar36) * dVar1 -
                      (((dVar40 - dVar36 * dVar35) - (dVar34 - dVar36) * dVar35) - dVar36 * dVar1);
        dVar36 = dVar50 * dVar44;
        dVar37 = splitter * dVar44 - (splitter * dVar44 - dVar44);
        dVar1 = (dVar44 - dVar37) * dVar1 -
                (((dVar36 - dVar37 * dVar35) - dVar35 * (dVar44 - dVar37)) - dVar37 * dVar1);
        dStack_1148 = dVar40 + dVar1;
        dStack_1150 = (dVar40 - (dStack_1148 - (dStack_1148 - dVar40))) +
                      (dVar1 - (dStack_1148 - dVar40));
        dStack_1140 = dVar36 + dStack_1148;
        dStack_1148 = dStack_1148 - (dStack_1140 - dVar36);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1158,pdVar25);
        pdVar24 = pdVar25;
        pdVar27 = pdVar26;
      }
    }
    if ((dVar45 != 0.0) || (pdVar25 = pdVar24, pdVar26 = pdVar27, NAN(dVar45))) {
      dVar36 = -dVar33;
      dVar35 = dVar45 * dVar36;
      dVar37 = splitter * dVar36 - (dVar33 + splitter * dVar36);
      dVar1 = dVar45 * splitter - (dVar45 * splitter - dVar45);
      dVar40 = (dVar45 - dVar1) * (dVar36 - dVar37) -
               (((dVar35 - dVar37 * dVar1) - dVar1 * (dVar36 - dVar37)) - dVar37 * (dVar45 - dVar1))
      ;
      dVar34 = dVar31 * splitter - (dVar31 * splitter - dVar31);
      dVar36 = dVar31 - dVar34;
      dVar37 = dVar31 * dVar40;
      dVar1 = splitter * dVar40 - (splitter * dVar40 - dVar40);
      dStack_1158 = (dVar40 - dVar1) * dVar36 -
                    (((dVar37 - dVar1 * dVar34) - (dVar40 - dVar1) * dVar34) - dVar1 * dVar36);
      dVar31 = dVar31 * dVar35;
      dVar1 = splitter * dVar35 - (splitter * dVar35 - dVar35);
      dVar1 = (dVar35 - dVar1) * dVar36 -
              (((dVar31 - dVar1 * dVar34) - dVar34 * (dVar35 - dVar1)) - dVar1 * dVar36);
      dStack_1148 = dVar1 + dVar37;
      dStack_1150 = (dVar37 - (dStack_1148 - (dStack_1148 - dVar37))) +
                    (dVar1 - (dStack_1148 - dVar37));
      dStack_1140 = dVar31 + dStack_1148;
      dStack_1148 = dStack_1148 - (dStack_1140 - dVar31);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1158,pdVar27);
      if ((dVar46 != 0.0) || (pdVar25 = pdVar27, pdVar26 = pdVar24, NAN(dVar46))) {
        dVar33 = dVar46 * splitter - (dVar46 * splitter - dVar46);
        dVar36 = dVar46 - dVar33;
        dVar1 = dVar46 * dVar40;
        dVar37 = dVar40 * splitter - (dVar40 * splitter - dVar40);
        dStack_1158 = (dVar40 - dVar37) * dVar36 -
                      (((dVar1 - dVar37 * dVar33) - (dVar40 - dVar37) * dVar33) - dVar37 * dVar36);
        dVar37 = dVar35 * dVar46;
        dVar34 = splitter * dVar35 - (splitter * dVar35 - dVar35);
        dVar36 = (dVar35 - dVar34) * dVar36 -
                 (((dVar37 - dVar34 * dVar33) - dVar33 * (dVar35 - dVar34)) - dVar34 * dVar36);
        dStack_1148 = dVar1 + dVar36;
        dStack_1150 = (dVar1 - (dStack_1148 - (dStack_1148 - dVar1))) +
                      (dVar36 - (dStack_1148 - dVar1));
        dStack_1140 = dVar37 + dStack_1148;
        dStack_1148 = dStack_1148 - (dStack_1140 - dVar37);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1158,pdVar24);
        pdVar25 = pdVar24;
        pdVar26 = pdVar27;
      }
    }
  }
  if ((dVar51 != 0.0) || (NAN(dVar51))) {
    if ((dVar45 != 0.0) || (pdVar27 = pdVar25, pdVar24 = pdVar26, NAN(dVar45))) {
      dVar35 = dVar51 * dVar45;
      dVar36 = dVar51 * splitter - (dVar51 * splitter - dVar51);
      dVar1 = dVar45 * splitter - (dVar45 * splitter - dVar45);
      dVar40 = (dVar45 - dVar1) * (dVar51 - dVar36) -
               (((dVar35 - dVar36 * dVar1) - dVar1 * (dVar51 - dVar36)) - dVar36 * (dVar45 - dVar1))
      ;
      dVar34 = (double)auStack_1098._0_8_ * splitter -
               ((double)auStack_1098._0_8_ * splitter - (double)auStack_1098._0_8_);
      dVar36 = (double)auStack_1098._0_8_ - dVar34;
      dVar37 = (double)auStack_1098._0_8_ * dVar40;
      dVar1 = splitter * dVar40 - (splitter * dVar40 - dVar40);
      dStack_1158 = (dVar40 - dVar1) * dVar36 -
                    (((dVar37 - dVar1 * dVar34) - (dVar40 - dVar1) * dVar34) - dVar1 * dVar36);
      dVar45 = (double)auStack_1098._0_8_ * dVar35;
      dVar1 = splitter * dVar35 - (splitter * dVar35 - dVar35);
      dVar1 = (dVar35 - dVar1) * dVar36 -
              (((dVar45 - dVar1 * dVar34) - dVar34 * (dVar35 - dVar1)) - dVar1 * dVar36);
      dStack_1148 = dVar1 + dVar37;
      dStack_1150 = (dVar37 - (dStack_1148 - (dStack_1148 - dVar37))) +
                    (dVar1 - (dStack_1148 - dVar37));
      dStack_1140 = dVar45 + dStack_1148;
      dStack_1148 = dStack_1148 - (dStack_1140 - dVar45);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1158,pdVar26);
      if ((dVar29 != 0.0) || (pdVar27 = pdVar26, pdVar24 = pdVar25, NAN(dVar29))) {
        dVar34 = dVar29 * splitter - (dVar29 * splitter - dVar29);
        dVar36 = dVar29 - dVar34;
        dVar1 = dVar29 * dVar40;
        dVar45 = dVar40 * splitter - (dVar40 * splitter - dVar40);
        dStack_1158 = (dVar40 - dVar45) * dVar36 -
                      (((dVar1 - dVar45 * dVar34) - (dVar40 - dVar45) * dVar34) - dVar45 * dVar36);
        dVar45 = dVar35 * dVar29;
        dVar37 = splitter * dVar35 - (splitter * dVar35 - dVar35);
        dVar36 = (dVar35 - dVar37) * dVar36 -
                 (((dVar45 - dVar37 * dVar34) - dVar34 * (dVar35 - dVar37)) - dVar37 * dVar36);
        dStack_1148 = dVar1 + dVar36;
        dStack_1150 = (dVar1 - (dStack_1148 - (dStack_1148 - dVar1))) +
                      (dVar36 - (dStack_1148 - dVar1));
        dStack_1140 = dVar45 + dStack_1148;
        dStack_1148 = dStack_1148 - (dStack_1140 - dVar45);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1158,pdVar25);
        pdVar27 = pdVar25;
        pdVar24 = pdVar26;
      }
    }
    pdVar25 = pdVar27;
    pdVar26 = pdVar24;
    if ((dVar55 == 0.0) && (!NAN(dVar55))) goto LAB_00151938;
    dVar36 = -dVar51;
    dVar34 = dVar55 * dVar36;
    dVar45 = splitter * dVar36 - (dVar51 + splitter * dVar36);
    dVar1 = dVar55 * splitter - (dVar55 * splitter - dVar55);
    dVar37 = (dVar55 - dVar1) * (dVar36 - dVar45) -
             (((dVar34 - dVar45 * dVar1) - dVar1 * (dVar36 - dVar45)) - dVar45 * (dVar55 - dVar1));
    dVar55 = dVar41 * splitter - (dVar41 * splitter - dVar41);
    dVar36 = dVar41 - dVar55;
    dVar45 = dVar41 * dVar37;
    dVar1 = splitter * dVar37 - (splitter * dVar37 - dVar37);
    dStack_1158 = (dVar37 - dVar1) * dVar36 -
                  (((dVar45 - dVar1 * dVar55) - (dVar37 - dVar1) * dVar55) - dVar1 * dVar36);
    dVar41 = dVar41 * dVar34;
    dVar1 = splitter * dVar34 - (splitter * dVar34 - dVar34);
    dVar1 = (dVar34 - dVar1) * dVar36 -
            (((dVar41 - dVar1 * dVar55) - dVar55 * (dVar34 - dVar1)) - dVar1 * dVar36);
    dStack_1148 = dVar1 + dVar45;
    dStack_1150 = (dVar45 - (dStack_1148 - (dStack_1148 - dVar45))) +
                  (dVar1 - (dStack_1148 - dVar45));
    dStack_1140 = dVar41 + dStack_1148;
    dStack_1148 = dStack_1148 - (dStack_1140 - dVar41);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1158,pdVar24);
    if ((dVar50 == 0.0) && (!NAN(dVar50))) goto LAB_00151978;
    dVar35 = dVar50 * splitter - (dVar50 * splitter - dVar50);
    dVar36 = dVar50 - dVar35;
    dVar1 = dVar50 * dVar37;
    dVar45 = dVar37 * splitter - (dVar37 * splitter - dVar37);
    dStack_1158 = (dVar37 - dVar45) * dVar36 -
                  (((dVar1 - dVar45 * dVar35) - (dVar37 - dVar45) * dVar35) - dVar45 * dVar36);
    dVar45 = dVar34 * dVar50;
    dVar55 = splitter * dVar34 - (splitter * dVar34 - dVar34);
    dVar36 = (dVar34 - dVar55) * dVar36 -
             (((dVar45 - dVar55 * dVar35) - dVar35 * (dVar34 - dVar55)) - dVar55 * dVar36);
    dStack_1148 = dVar1 + dVar36;
    dStack_1150 = (dVar1 - (dStack_1148 - (dStack_1148 - dVar1))) + (dVar36 - (dStack_1148 - dVar1))
    ;
    dStack_1140 = dVar45 + dStack_1148;
    dStack_1148 = dStack_1148 - (dStack_1140 - dVar45);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1158,pdVar27);
  }
  else {
LAB_00151938:
    if ((dVar50 == 0.0) && (pdVar24 = pdVar25, pdVar27 = pdVar26, !NAN(dVar50))) goto LAB_00151978;
  }
  pdVar24 = pdVar26;
  iVar20 = scale_expansion_zeroelim(elen,adStack_db8,dVar50,adStack_f18);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar20,adStack_f18,pdVar24);
  pdVar27 = pdVar25;
LAB_00151978:
  if ((dVar29 != 0.0) || (pdVar25 = pdVar27, NAN(dVar29))) {
    iVar20 = scale_expansion_zeroelim(iVar22,adStack_df8,dVar29,adStack_f18);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar20,adStack_f18,pdVar27);
    pdVar25 = pdVar24;
    pdVar24 = pdVar27;
  }
  if ((dVar46 != 0.0) || (NAN(dVar46))) {
    iVar19 = scale_expansion_zeroelim(iVar19,adStack_e38,dVar46,adStack_f18);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar19,adStack_f18,pdVar25);
    pdVar24 = pdVar25;
  }
  return pdVar24[(long)iVar18 + -1];
}

Assistant:

REAL orient3d(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;


  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  adz = pa[2] - pd[2];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  bdz = pb[2] - pd[2];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy) 
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    //if (fabs(det) > o3dstaticfilter) return det;
    if (det > o3dstaticfilter) return det;
    if (det < -o3dstaticfilter) return det;
  }


  REAL permanent, errbound;

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}